

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdecompresshelper.cpp
# Opt level: O1

QByteArrayList * QDecompressHelper::acceptedEncoding(void)

{
  QList<QByteArray> *in_RDI;
  long lVar1;
  long in_FS_OFFSET;
  QByteArray local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).d = (Data *)0x0;
  (in_RDI->d).ptr = (QByteArray *)0x0;
  (in_RDI->d).size = 0;
  QList<QByteArray>::reserve(in_RDI,4);
  lVar1 = 8;
  do {
    QByteArray::QByteArray
              (&local_40,*(char **)((long)&(anonymous_namespace)::contentEncodingMapping + lVar1),
               *(longlong *)((long)&PTR_typeinfo_name_002d2ed8 + lVar1));
    QtPrivate::QMovableArrayOps<QByteArray>::emplace<QByteArray>
              ((QMovableArrayOps<QByteArray> *)in_RDI,(in_RDI->d).size,&local_40);
    QList<QByteArray>::end(in_RDI);
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,1,0x10);
      }
    }
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QByteArrayList QDecompressHelper::acceptedEncoding()
{
    QByteArrayList list;
    list.reserve(std::size(contentEncodingMapping));
    for (const auto &mapping : contentEncodingMapping) {
        list << mapping.name.toByteArray();
    }
    return list;
}